

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void lodepng_clear_icc(LodePNGInfo *info)

{
  string_cleanup(&info->iccp_name);
  free(info->iccp_profile);
  info->iccp_profile = (uchar *)0x0;
  info->iccp_profile_size = 0;
  info->iccp_defined = 0;
  return;
}

Assistant:

void lodepng_clear_icc(LodePNGInfo* info) {
  string_cleanup(&info->iccp_name);
  lodepng_free(info->iccp_profile);
  info->iccp_profile = NULL;
  info->iccp_profile_size = 0;
  info->iccp_defined = 0;
}